

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawShaderDrawParametersTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::Draw::anon_unknown_0::DrawTest::iterate(TestStatus *__return_storage_ptr__,DrawTest *this)

{
  uint uVar1;
  DeviceInterface *pDVar2;
  Allocation *pAVar3;
  Buffer *pBVar4;
  VkCommandBuffer_s *pVVar5;
  _func_int **pp_Var6;
  Image *this_00;
  TestLog *log;
  DrawTestsBaseClass *pDVar7;
  DrawTest *pDVar8;
  int i;
  uint uVar9;
  VkResult VVar10;
  uint uVar11;
  VkDevice pVVar12;
  VkQueue pVVar13;
  long lVar14;
  Allocator *allocator;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  Vec2 *pVVar19;
  Vec2 *pVVar20;
  bool bVar21;
  undefined1 local_160 [8];
  VkDeviceMemory VStack_158;
  VkDeviceSize VStack_150;
  void *local_148;
  DrawTest *local_138;
  TestFlags local_12c;
  Vec2 offset;
  VkSubmitInfo submitInfo;
  Vec2 perDrawOffset [3];
  Vec2 perInstanceOffset [3];
  VkDeviceSize vertexBufferOffset;
  VkBuffer vertexBuffer;
  
  DrawTestsBaseClass::beginRenderPass(&this->super_DrawTestsBaseClass);
  vertexBufferOffset = 0;
  vertexBuffer.m_internal =
       (((this->super_DrawTestsBaseClass).m_vertexBuffer.m_ptr)->m_object).
       super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x58])
            (pDVar2,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x4c])
            (pDVar2,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_DrawTestsBaseClass).m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  if ((this->m_flags & 2) != 0) {
    pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
    (*pDVar2->_vptr_DeviceInterface[0x57])
              (pDVar2,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                      super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
               (((this->m_indexBuffer).m_ptr)->m_object).
               super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,0,1);
  }
  uVar11 = this->m_flags;
  uVar1 = (uVar11 & 1) * 2 + 1;
  local_138 = this;
  if ((uVar11 & 4) != 0) {
    uVar16 = (uVar11 & 0x10) >> 3;
    uVar15 = (uVar11 & 0x10) >> 4;
    uVar9 = (int)(uVar11 << 0x1b) >> 0x1f & 3;
    if ((uVar11 & 2) == 0) {
      pAVar3 = (((this->m_indirectBuffer).m_ptr)->m_allocation).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      submitInfo._0_8_ = &PTR__Allocation_00d7f278;
      submitInfo.pNext = (void *)(pAVar3->m_memory).m_internal;
      submitInfo._16_8_ = pAVar3->m_offset;
      submitInfo.pWaitSemaphores = (VkSemaphore *)pAVar3->m_hostPtr;
      *(undefined4 *)&(submitInfo.pWaitSemaphores)->m_internal = 4;
      *(uint *)((long)&(submitInfo.pWaitSemaphores)->m_internal + 4) = uVar1;
      *(undefined4 *)&submitInfo.pWaitSemaphores[1].m_internal = 2;
      *(uint *)((long)&submitInfo.pWaitSemaphores[1].m_internal + 4) = uVar16;
      *(undefined4 *)&submitInfo.pWaitSemaphores[2].m_internal = 4;
      *(uint *)((long)&submitInfo.pWaitSemaphores[2].m_internal + 4) = uVar1;
      *(undefined4 *)&submitInfo.pWaitSemaphores[3].m_internal = 9;
      *(uint *)((long)&submitInfo.pWaitSemaphores[3].m_internal + 4) = uVar15;
      *(undefined4 *)&submitInfo.pWaitSemaphores[4].m_internal = 4;
      *(uint *)((long)&submitInfo.pWaitSemaphores[4].m_internal + 4) = uVar1;
      *(undefined4 *)&submitInfo.pWaitSemaphores[5].m_internal = 2;
      *(uint *)((long)&submitInfo.pWaitSemaphores[5].m_internal + 4) = uVar9;
      ::vk::Allocation::~Allocation((Allocation *)&submitInfo);
      pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
      pVVar12 = Context::getDevice((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
      pBVar4 = (this->m_indirectBuffer).m_ptr;
      pAVar3 = (pBVar4->m_allocation).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      submitInfo._0_8_ = &PTR__Allocation_00d7f278;
      submitInfo.pNext = (void *)(pAVar3->m_memory).m_internal;
      submitInfo._16_8_ = pAVar3->m_offset;
      submitInfo.pWaitSemaphores = (VkSemaphore *)pAVar3->m_hostPtr;
      pAVar3 = (pBVar4->m_allocation).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      local_160 = (undefined1  [8])&PTR__Allocation_00d7f278;
      VStack_158.m_internal = (pAVar3->m_memory).m_internal;
      VStack_150 = pAVar3->m_offset;
      local_148 = pAVar3->m_hostPtr;
      ::vk::flushMappedMemoryRange
                (pDVar2,pVVar12,(VkDeviceMemory)submitInfo.pNext,VStack_150,0xffffffffffffffff);
    }
    else {
      pAVar3 = (((this->m_indirectBuffer).m_ptr)->m_allocation).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      submitInfo._0_8_ = &PTR__Allocation_00d7f278;
      submitInfo.pNext = (void *)(pAVar3->m_memory).m_internal;
      submitInfo._16_8_ = pAVar3->m_offset;
      submitInfo.pWaitSemaphores = (VkSemaphore *)pAVar3->m_hostPtr;
      *(undefined4 *)&(submitInfo.pWaitSemaphores)->m_internal = 4;
      *(uint *)((long)&(submitInfo.pWaitSemaphores)->m_internal + 4) = uVar1;
      submitInfo.pWaitSemaphores[1].m_internal = 0x10000000b;
      *(uint *)&submitInfo.pWaitSemaphores[2].m_internal = uVar16;
      *(undefined4 *)((long)&submitInfo.pWaitSemaphores[2].m_internal + 4) = 4;
      *(uint *)&submitInfo.pWaitSemaphores[3].m_internal = uVar1;
      *(undefined8 *)((long)&submitInfo.pWaitSemaphores[3].m_internal + 4) = 0x400000011;
      *(uint *)((long)&submitInfo.pWaitSemaphores[4].m_internal + 4) = uVar15;
      *(undefined4 *)&submitInfo.pWaitSemaphores[5].m_internal = 4;
      *(uint *)((long)&submitInfo.pWaitSemaphores[5].m_internal + 4) = uVar1;
      submitInfo.pWaitSemaphores[6].m_internal = 0x10000000b;
      *(uint *)&submitInfo.pWaitSemaphores[7].m_internal = uVar9;
      ::vk::Allocation::~Allocation((Allocation *)&submitInfo);
      pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
      pVVar12 = Context::getDevice((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
      pBVar4 = (this->m_indirectBuffer).m_ptr;
      pAVar3 = (pBVar4->m_allocation).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      submitInfo._0_8_ = &PTR__Allocation_00d7f278;
      submitInfo.pNext = (void *)(pAVar3->m_memory).m_internal;
      submitInfo._16_8_ = pAVar3->m_offset;
      submitInfo.pWaitSemaphores = (VkSemaphore *)pAVar3->m_hostPtr;
      pAVar3 = (pBVar4->m_allocation).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      local_160 = (undefined1  [8])&PTR__Allocation_00d7f278;
      VStack_158.m_internal = (pAVar3->m_memory).m_internal;
      VStack_150 = pAVar3->m_offset;
      local_148 = pAVar3->m_hostPtr;
      ::vk::flushMappedMemoryRange
                (pDVar2,pVVar12,(VkDeviceMemory)submitInfo.pNext,VStack_150,0xffffffffffffffff);
    }
    ::vk::Allocation::~Allocation((Allocation *)local_160);
    ::vk::Allocation::~Allocation((Allocation *)&submitInfo);
  }
  pDVar8 = local_138;
  pDVar7 = &local_138->super_DrawTestsBaseClass;
  uVar11 = local_138->m_flags;
  if ((uVar11 & 4) == 0) {
    pDVar2 = (local_138->super_DrawTestsBaseClass).m_vk;
    pVVar5 = (local_138->super_DrawTestsBaseClass).m_cmdBuffer.
             super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    if ((uVar11 & 2) == 0) {
      (*pDVar2->_vptr_DeviceInterface[0x59])(pDVar2,pVVar5,4,(ulong)uVar1,2,2);
    }
    else {
      (*pDVar2->_vptr_DeviceInterface[0x5a])(pDVar2,pVVar5,4,(ulong)uVar1,0xb,1,2);
    }
  }
  else {
    pDVar2 = (local_138->super_DrawTestsBaseClass).m_vk;
    pp_Var6 = pDVar2->_vptr_DeviceInterface;
    if ((uVar11 & 2) == 0) {
      (*pp_Var6[0x5b])();
    }
    else {
      (*pp_Var6[0x5c])(pDVar2,(local_138->super_DrawTestsBaseClass).m_cmdBuffer.
                              super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                       (((local_138->m_indirectBuffer).m_ptr)->m_object).
                       super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,0,
                       (ulong)(((uVar11 & 8) >> 2) + 1),0x14);
    }
  }
  pDVar2 = (pDVar8->super_DrawTestsBaseClass).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x76])
            (pDVar2,(pDVar8->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar2 = (pDVar8->super_DrawTestsBaseClass).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x4a])
            (pDVar2,(pDVar8->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pVVar13 = Context::getUniversalQueue
                      ((pDVar8->super_DrawTestsBaseClass).super_TestInstance.m_context);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  pDVar2 = (pDVar8->super_DrawTestsBaseClass).m_vk;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&pDVar7->m_cmdBuffer;
  VVar10 = (*pDVar2->_vptr_DeviceInterface[2])(pDVar2,pVVar13,1,&submitInfo,0);
  ::vk::checkResult(VVar10,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawShaderDrawParametersTests.cpp"
                    ,0x13b);
  pDVar2 = (pDVar8->super_DrawTestsBaseClass).m_vk;
  VVar10 = (*pDVar2->_vptr_DeviceInterface[3])(pDVar2,pVVar13);
  ::vk::checkResult(VVar10,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawShaderDrawParametersTests.cpp"
                    ,0x13c);
  submitInfo._0_8_ = ::vk::mapVkFormat((pDVar8->super_DrawTestsBaseClass).m_colorAttachmentFormat);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&vertexBufferOffset,(TextureFormat *)&submitInfo,0x100,0x100,1);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&vertexBuffer,(TextureLevel *)&vertexBufferOffset);
  perInstanceOffset[0].m_data[0] = 0.0;
  perInstanceOffset[0].m_data[1] = 0.0;
  perInstanceOffset[1].m_data[0] = -0.3;
  perInstanceOffset[1].m_data[1] = 0.0;
  perInstanceOffset[2].m_data[0] = 0.0;
  perInstanceOffset[2].m_data[1] = 0.3;
  perDrawOffset[0].m_data[0] = 0.0;
  perDrawOffset[0].m_data[1] = 0.0;
  perDrawOffset[1].m_data[0] = -0.3;
  perDrawOffset[1].m_data[1] = -0.3;
  perDrawOffset[2].m_data[0] = 0.3;
  perDrawOffset[2].m_data[1] = 0.3;
  lVar14 = 0;
  do {
    (&submitInfo.sType)[lVar14] = 0x3f800000;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x3f8000003f800000;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x3f80000000000000;
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0x3f800000;
  local_12c = pDVar8->m_flags;
  local_160._0_4_ = R;
  local_160._4_4_ = SNORM_INT8;
  VStack_158.m_internal = 0x3f80000000000000;
  tcu::clear((PixelBufferAccess *)&vertexBuffer,(Vec4 *)local_160);
  pVVar19 = perDrawOffset;
  uVar17 = 0;
  do {
    pVVar20 = perInstanceOffset;
    uVar18 = 0;
    do {
      offset.m_data[0] = 0.0;
      offset.m_data[1] = 0.0;
      lVar14 = 0;
      do {
        offset.m_data[lVar14] = pVVar20->m_data[lVar14] + pVVar19->m_data[lVar14];
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      uVar1 = local_138->m_flags;
      tcu::getSubregion((PixelBufferAccess *)local_160,(PixelBufferAccess *)&vertexBuffer,
                        (int)((offset.m_data[0] + 0.7) * 256.0 * 0.5),
                        (int)((offset.m_data[1] + 0.7) * 256.0 * 0.5),0x4c,0x4c);
      uVar11 = (uint)uVar17;
      if ((uVar1 & 8) == 0) {
        uVar11 = (uint)uVar18;
      }
      tcu::clear((PixelBufferAccess *)local_160,(Vec4 *)(&submitInfo.sType + (ulong)uVar11 * 4));
      pDVar8 = local_138;
      if ((local_12c & 1) == 0) break;
      pVVar20 = pVVar20 + 1;
      bVar21 = uVar18 < 2;
      uVar18 = uVar18 + 1;
    } while (bVar21);
    if ((local_12c & 8) == 0) break;
    pVVar19 = pVVar19 + 1;
    bVar21 = uVar17 < 2;
    uVar17 = uVar17 + 1;
  } while (bVar21);
  this_00 = (local_138->super_DrawTestsBaseClass).m_colorTargetImage.m_ptr;
  pVVar13 = Context::getUniversalQueue
                      ((local_138->super_DrawTestsBaseClass).super_TestInstance.m_context);
  allocator = Context::getDefaultAllocator
                        ((pDVar8->super_DrawTestsBaseClass).super_TestInstance.m_context);
  pDVar8 = local_138;
  Image::readSurface((ConstPixelBufferAccess *)&submitInfo,this_00,pVVar13,allocator,
                     VK_IMAGE_LAYOUT_GENERAL,(VkOffset3D)(ZEXT412(0) << 0x40),0x100,0x100,
                     VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  log = ((pDVar8->super_DrawTestsBaseClass).super_TestInstance.m_context)->m_testCtx->m_log;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_160,(TextureLevel *)&vertexBufferOffset);
  bVar21 = tcu::fuzzyCompare(log,"Result","Image comparison result",
                             (ConstPixelBufferAccess *)local_160,
                             (ConstPixelBufferAccess *)&submitInfo,0.05,COMPARE_LOG_RESULT);
  local_160 = (undefined1  [8])&VStack_150;
  if (bVar21) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"OK","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_160,
               VStack_158.m_internal + (long)local_160);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_160,"Rendered image is incorrect","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_160,
               VStack_158.m_internal + (long)local_160);
  }
  if (local_160 != (undefined1  [8])&VStack_150) {
    operator_delete((void *)local_160,VStack_150 + 1);
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&vertexBufferOffset);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus DrawTest::iterate (void)
{
	// Draw
	{
		beginRenderPass();

		const vk::VkDeviceSize	vertexBufferOffset	= 0;
		const vk::VkBuffer		vertexBuffer		= m_vertexBuffer->object();

		m_vk.cmdBindVertexBuffers	(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);
		m_vk.cmdBindPipeline		(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

		if (isIndexed())
			m_vk.cmdBindIndexBuffer(*m_cmdBuffer, m_indexBuffer->object(), 0ull, vk::VK_INDEX_TYPE_UINT32);

		const deUint32			numInstances		= isInstanced() ? MAX_INSTANCE_COUNT : 1;

		if (isIndirect())
		{
			if (isIndexed())
			{
				const vk::VkDrawIndexedIndirectCommand commands[] =
				{
					// indexCount, instanceCount, firstIndex, vertexOffset, firstInstance
					{ NUM_VERTICES,	numInstances,	NDX_FIRST_INDEX,	OFFSET_FIRST_INDEX,		(isFirstInstance() ? 2u : 0u) },
					{ NUM_VERTICES,	numInstances,	NDX_SECOND_INDEX,	OFFSET_SECOND_INDEX,	(isFirstInstance() ? 1u : 0u) },
					{ NUM_VERTICES,	numInstances,	NDX_FIRST_INDEX,	OFFSET_FIRST_INDEX,		(isFirstInstance() ? 3u : 0u) },
				};
				setIndirectCommand(commands);
			}
			else
			{
				const vk::VkDrawIndirectCommand commands[] =
				{
					// vertexCount, instanceCount, firstVertex, firstInstance
					{ NUM_VERTICES,	numInstances,	NDX_FIRST_VERTEX,	(isFirstInstance() ? 2u : 0u) },
					{ NUM_VERTICES,	numInstances,	NDX_SECOND_VERTEX,	(isFirstInstance() ? 1u : 0u) },
					{ NUM_VERTICES,	numInstances,	NDX_FIRST_VERTEX,	(isFirstInstance() ? 3u : 0u) },
				};
				setIndirectCommand(commands);
			}
		}

		if (isIndirect())
		{
			const deUint32 numIndirectDraws = isMultiDraw() ? MAX_INDIRECT_DRAW_COUNT : 1;

			if (isIndexed())
				m_vk.cmdDrawIndexedIndirect(*m_cmdBuffer, m_indirectBuffer->object(), 0ull, numIndirectDraws, sizeof(vk::VkDrawIndexedIndirectCommand));
			else
				m_vk.cmdDrawIndirect(*m_cmdBuffer, m_indirectBuffer->object(), 0ull, numIndirectDraws, sizeof(vk::VkDrawIndirectCommand));
		}
		else
		{
			const deUint32 firstInstance = 2;

			if (isIndexed())
				m_vk.cmdDrawIndexed(*m_cmdBuffer, NUM_VERTICES, numInstances, NDX_FIRST_INDEX, OFFSET_FIRST_INDEX, firstInstance);
			else
				m_vk.cmdDraw(*m_cmdBuffer, NUM_VERTICES, numInstances, NDX_FIRST_VERTEX, firstInstance);
		}

		m_vk.cmdEndRenderPass(*m_cmdBuffer);
		m_vk.endCommandBuffer(*m_cmdBuffer);
	}

	// Submit
	{
		const vk::VkQueue		queue		= m_context.getUniversalQueue();
		const vk::VkSubmitInfo	submitInfo	=
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0,											// deUint32					waitSemaphoreCount;
			DE_NULL,									// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,											// deUint32					commandBufferCount;
			&m_cmdBuffer.get(),							// const VkCommandBuffer*	pCommandBuffers;
			0,											// deUint32					signalSemaphoreCount;
			DE_NULL										// const VkSemaphore*		pSignalSemaphores;
		};
		VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));
		VK_CHECK(m_vk.queueWaitIdle(queue));
	}

	// Validate
	{
		tcu::TextureLevel referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), static_cast<int>(0.5f + WIDTH), static_cast<int>(0.5f + HEIGHT));

		drawReferenceImage(referenceFrame.getAccess());

		const vk::VkOffset3D				zeroOffset		= { 0, 0, 0 };
		const tcu::ConstPixelBufferAccess	renderedFrame	= m_colorTargetImage->readSurface(m_context.getUniversalQueue(), m_context.getDefaultAllocator(),
															  vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

		if (!tcu::fuzzyCompare(m_context.getTestContext().getLog(), "Result", "Image comparison result", referenceFrame.getAccess(), renderedFrame, 0.05f, tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Rendered image is incorrect");
		else
			return tcu::TestStatus::pass("OK");
	}
}